

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V2f __thiscall Imf_3_4::LatLongMap::pixelPosition(LatLongMap *this,Box2i *dataWindow,V3f *direction)

{
  V2f VVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  LatLongMap local_20 [8];
  
  latLong(local_20,direction);
  auVar2._4_4_ = local_20._0_4_;
  auVar2._0_4_ = local_20._4_4_;
  auVar2._8_8_ = 0;
  auVar2 = divps(auVar2,ZEXT816(0xc0490fdbc0c90fdb));
  iVar3 = (dataWindow->min).x;
  iVar4 = (dataWindow->min).y;
  VVar1.x = (float)((dataWindow->max).x - iVar3) * (auVar2._0_4_ + 0.5);
  VVar1.y = (float)((dataWindow->max).y - iVar4) * (auVar2._4_4_ + 0.5);
  *(ulong *)this = CONCAT44((float)iVar4 + VVar1.y,(float)iVar3 + VVar1.x);
  return VVar1;
}

Assistant:

V2f
pixelPosition (const Box2i& dataWindow, const V3f& direction)
{
    return pixelPosition (dataWindow, latLong (direction));
}